

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

void __thiscall CTcConstVal::set_list(CTcConstVal *this,CTPNList *lst)

{
  this->typ_ = TC_CVT_LIST;
  (this->val_).listval_.l_ = lst;
  CTcGenTarg::note_list(G_cg,(long)(lst->super_CTPNListBase).cnt_);
  return;
}

Assistant:

void CTcConstVal::set_list(CTPNList *lst)
{
    /* set the type */
    typ_ = TC_CVT_LIST;

    /* remember the list */
    val_.listval_.l_ = lst;

    /* for image file layout purposes, record the length of this list */
    G_cg->note_list(lst->get_count());
}